

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O3

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createDynamicMemAlloc
          (PSNodesSeq *__return_storage_ptr__,LLVMPointerGraphBuilder *this,CallInst *CInst,
          AllocationFunction type)

{
  PSNode *local_50;
  PSNodesSeq local_48;
  initializer_list<dg::pta::PSNode_*> local_20;
  
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->_repr = (PSNode *)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (type == REALLOC) {
    createRealloc(&local_48,this,CInst);
  }
  else {
    local_50 = createDynamicAlloc(this,CInst,type);
    local_20._M_array = &local_50;
    local_20._M_len = 1;
    PSNodesSeq::PSNodesSeq(&local_48,&local_20);
  }
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48._nodes.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48._nodes.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48._nodes.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  __return_storage_ptr__->_repr = local_48._repr;
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createDynamicMemAlloc(const llvm::CallInst *CInst,
                                               AllocationFunction type) {
    assert(type != AllocationFunction::NONE &&
           "BUG: creating dyn. memory node for NONMEM");

    PSNodesSeq seq;
    if (type == AllocationFunction::REALLOC) {
        seq = createRealloc(CInst);
    } else {
        seq = {createDynamicAlloc(CInst, type)};
    }
    return seq;
}